

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

Script * __thiscall
cfd::core::Descriptor::GetLockingScript(Script *__return_storage_ptr__,Descriptor *this)

{
  uint32_t uVar1;
  CfdException *this_00;
  reference object;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> local_a0;
  undefined1 local_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  allocator local_59;
  string local_58;
  uint32_t local_34;
  CfdSourceLocation local_30;
  Descriptor *local_18;
  Descriptor *this_local;
  
  local_18 = this;
  this_local = (Descriptor *)__return_storage_ptr__;
  uVar1 = GetNeedArgumentNum(this);
  if (uVar1 != 0) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x86c;
    local_30.funcname = "GetLockingScript";
    local_34 = GetNeedArgumentNum(this);
    logger::warn<unsigned_int>(&local_30,"Failed to empty argument. {}",&local_34);
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_58,"Failed to empty argument. need argument descriptor.",&local_59);
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_58);
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_88);
  GetLockingScriptAll(&local_a0,this,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_88);
  object = ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::operator[]
                     (&local_a0,0);
  Script::Script(__return_storage_ptr__,object);
  ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector(&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Script Descriptor::GetLockingScript() const {
  if (GetNeedArgumentNum() != 0) {
    warn(CFD_LOG_SOURCE, "Failed to empty argument. {}", GetNeedArgumentNum());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to empty argument. need argument descriptor.");
  }
  std::vector<std::string> list;
  return GetLockingScriptAll(&list)[0];
}